

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.h
# Opt level: O2

void __thiscall
checker_texture::checker_texture(checker_texture *this,double scale,color *c1,color *c2)

{
  undefined1 local_68 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  undefined1 local_48 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  
  std::make_shared<solid_color,vec3_const&>((vec3 *)local_48);
  local_48._16_8_ = local_48._0_8_;
  _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_;
  local_48._0_8_ = 0.0;
  local_48._8_8_ = 0.0;
  std::make_shared<solid_color,vec3_const&>((vec3 *)local_68);
  local_68._16_8_ = local_68._0_8_;
  _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_;
  local_68._0_8_ = 0.0;
  local_68._8_8_ = 0.0;
  checker_texture(this,scale,(shared_ptr<texture> *)(local_48 + 0x10),
                  (shared_ptr<texture> *)(local_68 + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
  return;
}

Assistant:

checker_texture(double scale, const color& c1, const color& c2)
      : checker_texture(scale, make_shared<solid_color>(c1), make_shared<solid_color>(c2)) {}